

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O0

void calculate_dqcoeff_and_store_log_scale
               (__m128i qcoeff,__m128i dequant,__m128i zero,tran_low_t *dqcoeff,int *log_scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  longlong in_RCX;
  longlong in_RDX;
  uint *in_RSI;
  uint *puVar8;
  undefined8 *in_RDI;
  undefined8 *puVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  __m128i a;
  __m128i a_00;
  __m128i alVar10;
  __m128i sign;
  __m128i sign_00;
  __m128i sign_01;
  __m128i dqcoeff32_1;
  __m128i dqcoeff32_0;
  __m128i high;
  __m128i low;
  __m128i sign_1;
  __m128i sign_0;
  __m128i coeff;
  __m128i coeff_sign;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  
  auVar7._8_8_ = in_XMM0_Qb;
  auVar7._0_8_ = in_XMM0_Qa;
  auVar2 = vpsraw_avx(auVar7,ZEXT416(0xf));
  alVar10[1] = (longlong)in_RSI;
  alVar10[0] = (longlong)in_RDI;
  sign[1] = in_RCX;
  sign[0] = in_RDX;
  puVar8 = in_RSI;
  puVar9 = in_RDI;
  alVar10 = invert_sign_sse2(alVar10,sign);
  sign_00[0] = alVar10[1];
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = in_XMM2_Qa;
  vpunpcklwd_avx(auVar2,auVar5);
  auVar6._8_8_ = in_XMM2_Qb;
  auVar6._0_8_ = in_XMM2_Qa;
  vpunpckhwd_avx(auVar2,auVar6);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar1 = vpmullw_avx(auVar4,auVar1);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar2 = vpmulhw_avx(auVar3,auVar2);
  auVar3 = vpunpcklwd_avx(auVar1,auVar2);
  auVar1 = vpunpckhwd_avx(auVar1,auVar2);
  auVar2 = vpsrld_avx(auVar3,ZEXT416(*in_RSI));
  auVar1 = vpsrld_avx(auVar1,ZEXT416(*in_RSI));
  local_218 = auVar2._0_8_;
  uStack_210 = auVar2._8_8_;
  a[1] = (longlong)puVar8;
  a[0] = (longlong)puVar9;
  sign_00[1] = in_RCX;
  alVar10 = invert_sign_32_sse2(a,sign_00);
  sign_01[0] = alVar10[1];
  local_228 = auVar1._0_8_;
  uStack_220 = auVar1._8_8_;
  a_00[1] = (longlong)puVar8;
  a_00[0] = (longlong)puVar9;
  sign_01[1] = in_RCX;
  invert_sign_32_sse2(a_00,sign_01);
  *in_RDI = local_218;
  in_RDI[1] = uStack_210;
  in_RDI[2] = local_228;
  in_RDI[3] = uStack_220;
  return;
}

Assistant:

static inline void calculate_dqcoeff_and_store_log_scale(__m128i qcoeff,
                                                         __m128i dequant,
                                                         const __m128i zero,
                                                         tran_low_t *dqcoeff,
                                                         const int *log_scale) {
  // calculate abs
  __m128i coeff_sign = _mm_srai_epi16(qcoeff, 15);
  __m128i coeff = invert_sign_sse2(qcoeff, coeff_sign);

  const __m128i sign_0 = _mm_unpacklo_epi16(coeff_sign, zero);
  const __m128i sign_1 = _mm_unpackhi_epi16(coeff_sign, zero);

  const __m128i low = _mm_mullo_epi16(coeff, dequant);
  const __m128i high = _mm_mulhi_epi16(coeff, dequant);
  __m128i dqcoeff32_0 = _mm_unpacklo_epi16(low, high);
  __m128i dqcoeff32_1 = _mm_unpackhi_epi16(low, high);

  dqcoeff32_0 = _mm_srli_epi32(dqcoeff32_0, *log_scale);
  dqcoeff32_1 = _mm_srli_epi32(dqcoeff32_1, *log_scale);

  dqcoeff32_0 = invert_sign_32_sse2(dqcoeff32_0, sign_0);
  dqcoeff32_1 = invert_sign_32_sse2(dqcoeff32_1, sign_1);

  _mm_store_si128((__m128i *)(dqcoeff), dqcoeff32_0);
  _mm_store_si128((__m128i *)(dqcoeff + 4), dqcoeff32_1);
}